

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::Fixed16CasesWithSizes_WriteLittleEndian16_Test::
~Fixed16CasesWithSizes_WriteLittleEndian16_Test
          (Fixed16CasesWithSizes_WriteLittleEndian16_Test *this)

{
  io::anon_unknown_0::Fixed16CasesWithSizes_WriteLittleEndian16_Test::
  ~Fixed16CasesWithSizes_WriteLittleEndian16_Test
            ((Fixed16CasesWithSizes_WriteLittleEndian16_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(Fixed16CasesWithSizes, WriteLittleEndian16) {
  Fixed16Case kFixed16Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteLittleEndian16(kFixed16Cases_case.value);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(sizeof(uint16_t), coded_output.ByteCount());
  }

  EXPECT_EQ(sizeof(uint16_t), output.ByteCount());
  EXPECT_EQ(0, memcmp(buffer_, kFixed16Cases_case.bytes, sizeof(uint16_t)));
}